

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O1

void __thiscall uWS::TopicTree::drain(TopicTree *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  Topic *pTVar3;
  Subscriber *pSVar4;
  _Rb_tree_node_base *p_Var5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  mapped_type *pmVar10;
  _Rb_tree_node_base *p_Var11;
  Subscriber *pSVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint64_t intersection;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  res;
  map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  complete;
  map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  intersectionCache;
  iterator it [64];
  iterator end [64];
  map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *perSubscriberIntersectingTopicMessages [64];
  ulong local_720;
  key_type_conflict1 local_718;
  uint local_70c;
  _Any_data *local_708;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_700;
  undefined1 *local_6e0;
  undefined8 local_6d8;
  undefined1 local_6d0;
  undefined7 uStack_6cf;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_6c0;
  Subscriber *local_690;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_688;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_668;
  undefined8 local_638 [64];
  long local_438 [64];
  long alStack_238 [65];
  
  if (this->numTriggeredTopics != 0) {
    if (this->numTriggeredTopics < 1) {
      uVar15 = 0;
    }
    else {
      lVar13 = 0;
      uVar15 = 0;
      do {
        pTVar3 = this->triggeredTopics[lVar13];
        if ((pTVar3->subs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::clear(&(pTVar3->messages)._M_t);
          this->triggeredTopics[lVar13]->triggered = false;
        }
        else {
          lVar7 = (long)(int)uVar15;
          uVar15 = uVar15 + 1;
          this->triggeredTopics[lVar7] = pTVar3;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < this->numTriggeredTopics);
    }
    this->numTriggeredTopics = uVar15;
    if (uVar15 != 0) {
      this->min = (Subscriber *)0xffffffffffffffff;
      if (0 < (int)uVar15) {
        pSVar12 = this->min;
        uVar8 = 0;
        do {
          if (((this->triggeredTopics[uVar8]->subs)._M_t._M_impl.super__Rb_tree_header._M_node_count
               != 0) &&
             (pSVar4 = *(Subscriber **)
                        (*(_Base_ptr *)
                          ((long)&(this->triggeredTopics[uVar8]->subs)._M_t._M_impl.
                                  super__Rb_tree_header._M_header + 0x10) + 1), pSVar4 < pSVar12)) {
            this->min = pSVar4;
            pSVar12 = pSVar4;
          }
          uVar8 = uVar8 + 1;
        } while (uVar15 != uVar8);
      }
      if (this->min != (Subscriber *)0xffffffffffffffff) {
        local_668._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_668._M_impl.super__Rb_tree_header._M_header;
        local_668._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_668._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_668._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_668._M_impl.super__Rb_tree_header._M_header._M_right =
             local_668._M_impl.super__Rb_tree_header._M_header._M_left;
        memset(local_638,0,0x200);
        memset(local_438,0,0x200);
        local_708 = (_Any_data *)this;
        if (0 < (int)uVar15) {
          uVar8 = 0;
          do {
            pTVar3 = this->triggeredTopics[uVar8];
            local_638[uVar8] =
                 *(_Base_ptr *)
                  ((long)&(pTVar3->subs)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
            local_438[uVar8] = (long)&(pTVar3->subs)._M_t._M_impl.super__Rb_tree_header;
            uVar8 = uVar8 + 1;
          } while (uVar15 != uVar8);
        }
        do {
          local_718 = 0;
          iVar2 = *(int *)((long)this + 0x230);
          local_70c = uVar15;
          if ((long)iVar2 < 1) {
            local_720 = 0xffffffffffffffff;
            uVar8 = 0;
          }
          else {
            uVar16 = 0;
            pSVar12 = *(Subscriber **)((long)this + 0x238);
            local_720 = 0xffffffffffffffff;
            uVar14 = 0;
            uVar8 = 0;
            do {
              p_Var11 = (_Rb_tree_node_base *)local_638[uVar14];
              p_Var5 = (_Rb_tree_node_base *)local_438[uVar14];
              if (p_Var11 != p_Var5) {
                if (*(Subscriber **)(p_Var11 + 1) == pSVar12) {
                  uVar16 = uVar16 | 1L << (uVar14 & 0x3f);
                  iVar17 = (int)uVar8;
                  uVar8 = (ulong)(iVar17 + 1);
                  alStack_238[iVar17] = *(long *)((long)local_708 + uVar14 * 8 + 0x30) + 0x60;
                  local_718 = uVar16;
                  p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
                  local_638[uVar14] = p_Var11;
                  if (p_Var11 != p_Var5) {
                    uVar9 = *(ulong *)(p_Var11 + 1);
                    goto LAB_00141ab0;
                  }
                  local_70c = local_70c - 1;
                }
                else if (p_Var11 != p_Var5) {
                  uVar9 = *(ulong *)(p_Var11 + 1);
LAB_00141ab0:
                  if (uVar9 < local_720) {
                    local_720 = uVar9;
                  }
                }
              }
              uVar14 = uVar14 + 1;
            } while ((long)iVar2 != uVar14);
          }
          pmVar10 = std::
                    map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator[]((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)&local_668,&local_718);
          this = (TopicTree *)local_708;
          uVar15 = local_70c;
          p_Var1 = &local_6c0._M_impl.super__Rb_tree_header;
          if ((pmVar10->first)._M_string_length == 0) {
            local_6c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_6c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_6c0._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_6c0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
            local_6c0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
            if (0 < (int)uVar8) {
              uVar16 = 0;
              do {
                std::
                _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>>>
                ::
                _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>>>
                          ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>>>
                            *)&local_6c0,*(_Base_ptr *)(alStack_238[uVar16] + 0x18),
                           (_Base_ptr)(alStack_238[uVar16] + 8));
                uVar16 = uVar16 + 1;
              } while (uVar8 != uVar16);
            }
            local_700.first._M_len = (size_t)&local_700.second;
            local_700.first._M_str = (pointer)0x0;
            local_700.second._M_len = local_700.second._M_len & 0xffffffffffffff00;
            local_6e0 = &local_6d0;
            local_6d8 = 0;
            local_6d0 = 0;
            for (p_Var11 = local_6c0._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var11 != p_Var1;
                p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
              std::__cxx11::string::_M_append((char *)&local_700,(ulong)p_Var11[1]._M_parent);
              std::__cxx11::string::_M_append((char *)&local_6e0,(ulong)p_Var11[2]._M_parent);
            }
            pSVar12 = *(Subscriber **)((long)this + 0x238);
            pmVar10 = std::
                      map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator[]((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)&local_668,&local_718);
            std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_700);
            std::__cxx11::string::operator=((string *)&pmVar10->second,(string *)&local_6e0);
            local_688.first._M_str = (pmVar10->first)._M_dataplus._M_p;
            local_688.first._M_len = (pmVar10->first)._M_string_length;
            local_688.second._M_str = (pmVar10->second)._M_dataplus._M_p;
            local_688.second._M_len = (pmVar10->second)._M_string_length;
            local_690 = pSVar12;
            if (*(long *)((long)this + 0x10) == 0) {
              std::__throw_bad_function_call();
            }
            (**(code **)((long)this + 0x18))((_Any_data *)this,&local_690,&local_688);
            if (local_6e0 != &local_6d0) {
              operator_delete(local_6e0,CONCAT71(uStack_6cf,local_6d0) + 1);
            }
            if ((basic_string_view<char,_std::char_traits<char>_> *)local_700.first._M_len !=
                &local_700.second) {
              operator_delete((void *)local_700.first._M_len,local_700.second._M_len + 1);
            }
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::~_Rb_tree(&local_6c0);
          }
          else {
            uVar6._0_1_ = *(char *)((long)local_708 + 0x238);
            uVar6._1_1_ = *(char *)((long)local_708 + 0x239);
            uVar6._2_1_ = *(char *)((long)local_708 + 0x23a);
            uVar6._3_1_ = *(char *)((long)local_708 + 0x23b);
            uVar6._4_1_ = *(char *)((long)local_708 + 0x23c);
            uVar6._5_1_ = *(char *)((long)local_708 + 0x23d);
            uVar6._6_1_ = *(char *)((long)local_708 + 0x23e);
            uVar6._7_1_ = *(char *)((long)local_708 + 0x23f);
            pmVar10 = std::
                      map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator[]((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)&local_668,&local_718);
            local_700.first._M_str = (pmVar10->first)._M_dataplus._M_p;
            local_700.first._M_len = (pmVar10->first)._M_string_length;
            local_700.second._M_str = (pmVar10->second)._M_dataplus._M_p;
            local_700.second._M_len = (pmVar10->second)._M_string_length;
            local_6c0._M_impl._0_8_ = uVar6;
            if (*(long *)((long)this + 0x10) == 0) {
              std::__throw_bad_function_call();
            }
            (**(code **)((long)this + 0x18))((_Any_data *)this,(Subscriber **)&local_6c0,&local_700)
            ;
          }
          *(ulong *)((long)this + 0x238) = local_720;
        } while (uVar15 != 0);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Rb_tree(&local_668);
      }
      if (0 < *(int *)((long)this + 0x230)) {
        lVar13 = 0;
        do {
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)(*(long *)((long)this + lVar13 * 8 + 0x30) + 0x60));
          *(undefined1 *)(*(long *)((long)this + lVar13 * 8 + 0x30) + 0x18) = 0;
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)((long)this + 0x230));
      }
      *(int *)((long)this + 0x230) = 0;
    }
  }
  return;
}

Assistant:

void drain() {

        /* Do nothing if nothing to send */
        if (!numTriggeredTopics) {
            return;
        }

        /* bug fix: Filter triggered topics without subscribers */
        int numFilteredTriggeredTopics = 0;
        for (int i = 0; i < numTriggeredTopics; i++) {
            if (triggeredTopics[i]->subs.size()) {
                triggeredTopics[numFilteredTriggeredTopics++] = triggeredTopics[i];
            } else {
                /* If we no longer have any subscribers, yet still keep this Topic alive (parent),
                 * make sure to clear its potential messages. */
                triggeredTopics[i]->messages.clear();
                triggeredTopics[i]->triggered = false;
            }
        }
        numTriggeredTopics = numFilteredTriggeredTopics;

        if (!numTriggeredTopics) {
            return;
        }

        /* bug fix: update min, as the one tracked via subscribe gets invalid as you unsubscribe */
        min = (Subscriber *)UINTPTR_MAX;
        for (int i = 0; i < numTriggeredTopics; i++) {
            if ((triggeredTopics[i]->subs.size()) && (min > *triggeredTopics[i]->subs.begin())) {
                min = *triggeredTopics[i]->subs.begin();
            }
        }

        /* Check if we really have any sockets still */
        if (min != (Subscriber *)UINTPTR_MAX) {

            /* Up to 64 triggered Topics per batch */
            std::map<uint64_t, std::pair<std::string, std::string>> intersectionCache;

            /* Loop over these here */
            std::set<Subscriber *>::iterator it[64];
            std::set<Subscriber *>::iterator end[64];
            for (int i = 0; i < numTriggeredTopics; i++) {
                it[i] = triggeredTopics[i]->subs.begin();
                end[i] = triggeredTopics[i]->subs.end();
            }
            
            /* Empty all sets from unique subscribers */
            for (int nonEmpty = numTriggeredTopics; nonEmpty; ) {

                Subscriber *nextMin = (Subscriber *)UINTPTR_MAX;

                /* The message sets relevant for this intersection */
                std::map<unsigned int, std::pair<std::string, std::string>> *perSubscriberIntersectingTopicMessages[64];
                int numPerSubscriberIntersectingTopicMessages = 0;

                uint64_t intersection = 0;

                for (int i = 0; i < numTriggeredTopics; i++) {
                    if ((it[i] != end[i]) && (*it[i] == min)) {

                        /* Mark this intersection */
                        intersection |= ((uint64_t)1 << i);
                        perSubscriberIntersectingTopicMessages[numPerSubscriberIntersectingTopicMessages++] = &triggeredTopics[i]->messages;

                        it[i]++;
                        if (it[i] == end[i]) {
                            nonEmpty--;
                        }
                        else {
                            if (nextMin > *it[i]) {
                                nextMin = *it[i];
                            }
                        }
                    }
                    else {
                        /* We need to lower nextMin to us, in the case of min being the last in a set */
                        if ((it[i] != end[i]) && (nextMin > *it[i])) {
                            nextMin = *it[i];
                        }
                    }
                }

                /* Generate cache for intersection */
                if (intersectionCache[intersection].first.length() == 0) {

                    /* Build the union in order without duplicates */
                    std::map<unsigned int, std::pair<std::string, std::string>> complete;
                    for (int i = 0; i < numPerSubscriberIntersectingTopicMessages; i++) {
                        complete.insert(perSubscriberIntersectingTopicMessages[i]->begin(), perSubscriberIntersectingTopicMessages[i]->end());
                    }

                    /* Create the linear cache, {inflated, deflated} */
                    std::pair<std::string, std::string> res;
                    for (auto &p : complete) {
                        res.first.append(p.second.first);
                        res.second.append(p.second.second);
                    }

                    cb(min, intersectionCache[intersection] = std::move(res));
                }
                else {
                    cb(min, intersectionCache[intersection]);
                }

                min = nextMin;
            }

        }

        /* Clear messages of triggered Topics */
        for (int i = 0; i < numTriggeredTopics; i++) {
            triggeredTopics[i]->messages.clear();
            triggeredTopics[i]->triggered = false;
        }
        numTriggeredTopics = 0;
    }